

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::SetupLegacyScriptPubKeyMan(CWallet *this)

{
  _func_int **pp_Var1;
  int iVar2;
  LegacyDataSPKM *this_00;
  mapped_type *ppSVar3;
  shared_count *psVar4;
  long *plVar5;
  long in_FS_OFFSET;
  uint256 id;
  LegacyDataSPKM *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
      ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
       (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
     (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0)) {
    (*((this->m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase
      [0xd])(&local_58);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_58,"bdb_ro");
    if (iVar2 == 0) {
      this_00 = (LegacyDataSPKM *)operator_new(0x328);
      LegacyDataSPKM::ScriptPubKeyMan(this_00,&this->super_WalletStorage);
    }
    else {
      this_00 = (LegacyDataSPKM *)operator_new(0x370);
      pp_Var1 = (_func_int **)this->m_keypool_size;
      LegacyDataSPKM::ScriptPubKeyMan(this_00,&this->super_WalletStorage);
      (this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan =
           (_func_int **)&PTR__LegacyScriptPubKeyMan_006bd738;
      (this_00->super_FillableSigningProvider).super_SigningProvider._vptr_SigningProvider =
           (_func_int **)&PTR__LegacyScriptPubKeyMan_006bd878;
      this_00[1].super_ScriptPubKeyMan._vptr_ScriptPubKeyMan = (_func_int **)0x0;
      this_00[1].super_ScriptPubKeyMan.m_storage = (WalletStorage *)0x7fffffffffffffff;
      this_00[1].super_ScriptPubKeyMan.NotifyWatchonlyChanged.super_signal_base._vptr_signal_base =
           pp_Var1;
      psVar4 = &this_00[1].super_ScriptPubKeyMan.NotifyWatchonlyChanged._pimpl.pn;
      *(undefined4 *)&this_00[1].super_ScriptPubKeyMan.NotifyWatchonlyChanged._pimpl.pn.pi_ = 0;
      this_00[1].super_ScriptPubKeyMan.NotifyCanGetAddressesChanged.super_signal_base.
      _vptr_signal_base = (_func_int **)0x0;
      this_00[1].super_ScriptPubKeyMan.NotifyCanGetAddressesChanged._pimpl.px =
           (element_type *)psVar4;
      this_00[1].super_ScriptPubKeyMan.NotifyCanGetAddressesChanged._pimpl.pn.pi_ =
           (sp_counted_base *)psVar4;
      this_00[1].super_ScriptPubKeyMan.NotifyFirstKeyTimeChanged.super_signal_base._vptr_signal_base
           = (_func_int **)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (wallet::LEGACY_OUTPUT_TYPES._16_8_ != 0) {
      plVar5 = (long *)wallet::LEGACY_OUTPUT_TYPES._16_8_;
      do {
        ppSVar3 = std::
                  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                  ::operator[](&this->m_internal_spk_managers,(key_type *)(plVar5 + 1));
        *ppSVar3 = &this_00->super_ScriptPubKeyMan;
        ppSVar3 = std::
                  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                  ::operator[](&this->m_external_spk_managers,(key_type *)(plVar5 + 1));
        *ppSVar3 = &this_00->super_ScriptPubKeyMan;
        plVar5 = (long *)*plVar5;
      } while (plVar5 != (long *)0x0);
    }
    (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_58,this_00);
    local_60 = this_00;
    AddScriptPubKeyMan(this,(uint256 *)&local_58,
                       (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                        )&local_60);
    if (local_60 != (LegacyDataSPKM *)0x0) {
      (*(local_60->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SetupLegacyScriptPubKeyMan()
{
    if (!m_internal_spk_managers.empty() || !m_external_spk_managers.empty() || !m_spk_managers.empty() || IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        return;
    }

    std::unique_ptr<ScriptPubKeyMan> spk_manager = m_database->Format() == "bdb_ro" ?
        std::make_unique<LegacyDataSPKM>(*this) :
        std::make_unique<LegacyScriptPubKeyMan>(*this, m_keypool_size);

    for (const auto& type : LEGACY_OUTPUT_TYPES) {
        m_internal_spk_managers[type] = spk_manager.get();
        m_external_spk_managers[type] = spk_manager.get();
    }
    uint256 id = spk_manager->GetID();
    AddScriptPubKeyMan(id, std::move(spk_manager));
}